

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateMemberConstexprConstructor(SingularStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar2 = "$name$_(nullptr, false)";
    uVar1 = 0x17;
  }
  else if (this->opts_->experimental_use_micro_string == true) {
    if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ ==
        (string *)0x0) {
      pcVar2 = "$name$_{}";
      uVar1 = 9;
    }
    else {
      pcVar2 = "$name$_($default_variable_field$)";
      uVar1 = 0x21;
    }
  }
  else {
    pcVar2 = "$name$_(\n    &$pbi$::fixed_address_empty_string,\n    ::_pbi::ConstantInitialized())"
    ;
    uVar1 = 0x53;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_(nullptr, false)");
    } else if (use_micro_string()) {
      if (EmptyDefault()) {
        p->Emit("$name$_{}");
      } else {
        p->Emit("$name$_($default_variable_field$)");
      }
    } else {
      p->Emit(
          "$name$_(\n"
          "    &$pbi$::fixed_address_empty_string,\n"
          "    ::_pbi::ConstantInitialized())");
    }
  }